

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# w3.cpp
# Opt level: O0

int32_t read_varint32(uint8_t **cursor,uint8_t *end)

{
  byte bVar1;
  uint32_t byte;
  uint32_t size;
  uint32_t shift;
  int32_t result;
  uint8_t *end_local;
  uint8_t **cursor_local;
  
  size = 0;
  byte = 0;
  do {
    bVar1 = read_byte(cursor,end);
    size = (bVar1 & 0x7f) << ((byte)byte & 0x1f) | size;
    byte = byte + 7;
  } while ((bVar1 & 0x80) != 0);
  if ((byte < 0x20) && ((bVar1 & 0x40) != 0)) {
    size = -1 << ((byte)byte & 0x1f) | size;
  }
  return size;
}

Assistant:

int32_t read_varint32 (uint8_t** cursor, const uint8_t* end)
{
    int32_t result = 0;
    uint32_t shift = 0;
    uint32_t size = 32;
    uint32_t byte = 0;
    do
    {
        byte = read_byte (cursor, end);
        result |= (byte & 0x7F) << shift;
        shift += 7;
    } while (byte & 0x80);

    // sign bit of byte is second high order bit (0x40)
    if ((shift < size) && (byte & 0x40))
        result |= (~0 << shift); // sign extend

    return result;
}